

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

bool __thiscall Gluco::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  FILE *pFVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  CRef CVar7;
  Lit *pLVar8;
  vec<unsigned_int> *ts;
  int *piVar9;
  uchar *puVar10;
  size_t *siglen;
  size_t *siglen_00;
  uchar *puVar11;
  size_t in_R8;
  bool local_a2;
  bool local_a1;
  int local_50;
  int local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int i_1;
  int local_34;
  int local_30;
  uint local_2c;
  Clause *pCStack_28;
  int i;
  Clause *c;
  SimpSolver *pSStack_18;
  CRef cr_local;
  SimpSolver *this_local;
  Lit l_local;
  
  c._4_4_ = cr;
  pSStack_18 = this;
  this_local._4_4_ = l.x;
  pCStack_28 = ClauseAllocator::operator[](&(this->super_Solver).ca,cr);
  iVar4 = Solver::decisionLevel(&this->super_Solver);
  if (iVar4 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0xc9,"bool Gluco::SimpSolver::strengthenClause(CRef, Lit)");
  }
  if ((this->use_simplification & 1U) == 0) {
    __assert_fail("use_simplification",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0xca,"bool Gluco::SimpSolver::strengthenClause(CRef, Lit)");
  }
  Queue<unsigned_int>::insert(&this->subsumption_queue,c._4_4_);
  if (((this->super_Solver).certifiedUNSAT & 1U) != 0) {
    local_2c = 0;
    while( true ) {
      uVar2 = local_2c;
      uVar5 = Clause::size(pCStack_28);
      puVar10 = (uchar *)(ulong)uVar5;
      if ((int)uVar5 <= (int)uVar2) break;
      pLVar8 = Clause::operator[](pCStack_28,local_2c);
      local_30 = this_local._4_4_;
      bVar3 = Gluco::Lit::operator!=(pLVar8,this_local._4_4_);
      if (bVar3) {
        pFVar1 = (FILE *)(this->super_Solver).certifiedOutput;
        pLVar8 = Clause::operator[](pCStack_28,local_2c);
        local_34 = pLVar8->x;
        iVar4 = Gluco::var((Lit)local_34);
        puVar11 = (uchar *)(ulong)local_2c;
        pLVar8 = Clause::operator[](pCStack_28,local_2c);
        i_1 = pLVar8->x;
        iVar6 = Gluco::sign((EVP_PKEY_CTX *)(ulong)(uint)i_1,puVar11,siglen,puVar10,in_R8);
        fprintf(pFVar1,"%i ",(ulong)((iVar4 + 1) * ((uint)((byte)iVar6 & 1) * -2 + 1)));
      }
      local_2c = local_2c + 1;
    }
    fprintf((FILE *)(this->super_Solver).certifiedOutput,"0\n");
  }
  iVar4 = Clause::size(pCStack_28);
  if (iVar4 == 2) {
    removeClause(this,c._4_4_);
    local_3c = this_local._4_4_;
    Clause::strengthen(pCStack_28,this_local._4_4_);
  }
  else {
    if (((this->super_Solver).certifiedUNSAT & 1U) != 0) {
      fprintf((FILE *)(this->super_Solver).certifiedOutput,"d ");
      local_40 = 0;
      while( true ) {
        uVar2 = local_40;
        uVar5 = Clause::size(pCStack_28);
        puVar10 = (uchar *)(ulong)uVar5;
        if ((int)uVar5 <= (int)uVar2) break;
        pFVar1 = (FILE *)(this->super_Solver).certifiedOutput;
        pLVar8 = Clause::operator[](pCStack_28,local_40);
        local_44 = pLVar8->x;
        iVar4 = Gluco::var((Lit)local_44);
        puVar11 = (uchar *)(ulong)local_40;
        pLVar8 = Clause::operator[](pCStack_28,local_40);
        local_48 = pLVar8->x;
        iVar6 = Gluco::sign((EVP_PKEY_CTX *)(ulong)local_48,puVar11,siglen_00,puVar10,in_R8);
        fprintf(pFVar1,"%i ",(ulong)((iVar4 + 1) * ((uint)((byte)iVar6 & 1) * -2 + 1)));
        local_40 = local_40 + 1;
      }
      fprintf((FILE *)(this->super_Solver).certifiedOutput,"0\n");
    }
    Solver::detachClause(&this->super_Solver,c._4_4_,true);
    local_4c = this_local._4_4_;
    Clause::strengthen(pCStack_28,this_local._4_4_);
    Solver::attachClause(&this->super_Solver,c._4_4_);
    local_50 = Gluco::var(this_local._4_4_);
    ts = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::operator[]
                   (&this->occurs,&local_50);
    remove<Gluco::vec<unsigned_int>,unsigned_int>(ts,(uint *)((long)&c + 4));
    iVar4 = toInt(this_local._4_4_);
    piVar9 = vec<int>::operator[](&this->n_occ,iVar4);
    *piVar9 = *piVar9 + -1;
    iVar4 = Gluco::var(this_local._4_4_);
    updateElimHeap(this,iVar4);
  }
  iVar4 = Clause::size(pCStack_28);
  if (iVar4 == 1) {
    pLVar8 = Clause::operator[](pCStack_28,0);
    bVar3 = Solver::enqueue(&this->super_Solver,(Lit)pLVar8->x,0xffffffff);
    local_a1 = false;
    if (bVar3) {
      CVar7 = Solver::propagate(&this->super_Solver);
      local_a1 = CVar7 == 0xffffffff;
    }
    local_a2 = local_a1;
  }
  else {
    local_a2 = true;
  }
  return local_a2;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (certifiedUNSAT) {
      for (int i = 0; i < c.size(); i++)
        if (c[i] != l) fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
      fprintf(certifiedOutput, "0\n");
    }

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        if (certifiedUNSAT) {
          fprintf(certifiedOutput, "d ");
          for (int i = 0; i < c.size(); i++)
            fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
          fprintf(certifiedOutput, "0\n");
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}